

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O0

void __thiscall
cppcms::json::bad_value_cast::bad_value_cast
          (bad_value_cast *this,string *s,json_type expected,json_type actual)

{
  ostream *out;
  ostream *poVar1;
  bad_cast *in_RDI;
  ostringstream msg;
  undefined8 in_stack_fffffffffffffe18;
  ostream *in_stack_fffffffffffffe20;
  string local_1c0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe60;
  char *in_stack_fffffffffffffe68;
  
  booster::bad_cast::bad_cast(in_RDI);
  *(undefined ***)in_RDI = &PTR__bad_value_cast_0012fbb0;
  (in_RDI->super_backtrace)._vptr_backtrace = (_func_int **)&PTR__bad_value_cast_0012fbd8;
  std::operator+(in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&stack0xfffffffffffffe60);
  std::operator<<((ostream *)&stack0xfffffffffffffe60," error converting from ");
  out = operator<<(in_stack_fffffffffffffe20,(json_type)((ulong)in_stack_fffffffffffffe18 >> 0x20));
  poVar1 = std::operator<<(out," to ");
  operator<<(out,(json_type)((ulong)poVar1 >> 0x20));
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::operator+=((string *)(in_RDI + 1),local_1c0);
  std::__cxx11::string::~string(local_1c0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&stack0xfffffffffffffe60);
  return;
}

Assistant:

bad_value_cast::bad_value_cast(std::string const &s,json_type expected, json_type actual) : 
		msg_("cppcms::json::bad_cast: " + s)
	{
		std::ostringstream msg;
		msg<<" error converting from "<<actual<<" to "<<expected;
		msg_ +=msg.str();

	}